

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

TSNode * ts_node__child(TSNode *__return_storage_ptr__,TSNode self,uint32_t child_index,
                       _Bool include_anonymous)

{
  _Bool _Var1;
  uint uVar2;
  uint32_t uVar3;
  uint32_t grandchild_count;
  uint32_t grandchild_index;
  NodeChildIterator iterator;
  uint32_t index;
  uint32_t uStack_2c;
  _Bool did_descend;
  TSNode result;
  _Bool include_anonymous_local;
  uint32_t child_index_local;
  
  index = self.context[0];
  uStack_2c = self.context[1];
  result.context[0] = self.context[2];
  result.context[1] = self.context[3];
  result.context._8_8_ = self.id;
  result.id = self.tree;
  iterator.alias_sequence._7_1_ = 1;
  result.tree._3_1_ = include_anonymous;
  result.tree._4_4_ = child_index;
  do {
    if ((iterator.alias_sequence._7_1_ & 1) == 0) {
      ts_node__null();
      return __return_storage_ptr__;
    }
    iterator.alias_sequence._7_1_ = 0;
    iterator.alias_sequence._0_4_ = 0;
    ts_node_iterate_children((NodeChildIterator *)&grandchild_count,(TSNode *)&index);
    while (_Var1 = ts_node_child_iterator_next
                             ((NodeChildIterator *)&grandchild_count,__return_storage_ptr__), _Var1)
    {
      _Var1 = ts_node__is_relevant(*__return_storage_ptr__,(_Bool)(result.tree._3_1_ & 1));
      if (_Var1) {
        if ((uint)iterator.alias_sequence == result.tree._4_4_) {
          ts_tree_set_cached_parent(self.tree,__return_storage_ptr__,&self);
          return __return_storage_ptr__;
        }
        iterator.alias_sequence._0_4_ = (uint)iterator.alias_sequence + 1;
      }
      else {
        uVar2 = result.tree._4_4_ - (uint)iterator.alias_sequence;
        uVar3 = ts_node__relevant_child_count
                          (*__return_storage_ptr__,(_Bool)(result.tree._3_1_ & 1));
        if (uVar2 < uVar3) {
          iterator.alias_sequence._7_1_ = 1;
          _index = *(undefined8 *)__return_storage_ptr__->context;
          result.context._0_8_ = *(undefined8 *)(__return_storage_ptr__->context + 2);
          result.context._8_8_ = __return_storage_ptr__->id;
          result.id = __return_storage_ptr__->tree;
          result.tree._4_4_ = uVar2;
          break;
        }
        iterator.alias_sequence._0_4_ = uVar3 + (uint)iterator.alias_sequence;
      }
    }
  } while( true );
}

Assistant:

static inline TSNode ts_node__child(TSNode self, uint32_t child_index, bool include_anonymous) {
  TSNode result = self;
  bool did_descend = true;

  while (did_descend) {
    did_descend = false;

    TSNode child;
    uint32_t index = 0;
    NodeChildIterator iterator = ts_node_iterate_children(&result);
    while (ts_node_child_iterator_next(&iterator, &child)) {
      if (ts_node__is_relevant(child, include_anonymous)) {
        if (index == child_index) {
          ts_tree_set_cached_parent(self.tree, &child, &self);
          return child;
        }
        index++;
      } else {
        uint32_t grandchild_index = child_index - index;
        uint32_t grandchild_count = ts_node__relevant_child_count(child, include_anonymous);
        if (grandchild_index < grandchild_count) {
          did_descend = true;
          result = child;
          child_index = grandchild_index;
          break;
        }
        index += grandchild_count;
      }
    }
  }

  return ts_node__null();
}